

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_spatializer_get_cone
               (ma_spatializer *pSpatializer,float *pInnerAngleInRadians,float *pOuterAngleInRadians
               ,float *pOuterGain)

{
  float *pOuterGain_local;
  float *pOuterAngleInRadians_local;
  float *pInnerAngleInRadians_local;
  ma_spatializer *pSpatializer_local;
  c89atomic_if32 r_2;
  c89atomic_if32 r_1;
  c89atomic_if32 r;
  
  if (pSpatializer != (ma_spatializer *)0x0) {
    if (pInnerAngleInRadians != (float *)0x0) {
      *pInnerAngleInRadians = pSpatializer->coneInnerAngleInRadians;
    }
    if (pOuterAngleInRadians != (float *)0x0) {
      *pOuterAngleInRadians = pSpatializer->coneOuterAngleInRadians;
    }
    if (pOuterGain != (float *)0x0) {
      *pOuterGain = pSpatializer->coneOuterGain;
    }
  }
  return;
}

Assistant:

MA_API void ma_spatializer_get_cone(const ma_spatializer* pSpatializer, float* pInnerAngleInRadians, float* pOuterAngleInRadians, float* pOuterGain)
{
    if (pSpatializer == NULL) {
        return;
    }

    if (pInnerAngleInRadians != NULL) {
        *pInnerAngleInRadians = c89atomic_load_f32(&pSpatializer->coneInnerAngleInRadians);
    }

    if (pOuterAngleInRadians != NULL) {
        *pOuterAngleInRadians = c89atomic_load_f32(&pSpatializer->coneOuterAngleInRadians);
    }

    if (pOuterGain != NULL) {
        *pOuterGain = c89atomic_load_f32(&pSpatializer->coneOuterGain);
    }
}